

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT3D.c
# Opt level: O1

uint32_t FACT3DCalculate(uint8_t *F3DInstance,F3DAUDIO_LISTENER *pListener,
                        F3DAUDIO_EMITTER *pEmitter,F3DAUDIO_DSP_SETTINGS *pDSPSettings)

{
  uint uVar1;
  
  if (pDSPSettings != (F3DAUDIO_DSP_SETTINGS *)0x0 &&
      (pEmitter != (F3DAUDIO_EMITTER *)0x0 && pListener != (F3DAUDIO_LISTENER *)0x0)) {
    if ((1 < pEmitter->ChannelCount) && (pEmitter->pChannelAzimuths == (float *)0x0)) {
      pEmitter->ChannelRadius = 1.0;
      uVar1 = pEmitter->ChannelCount - 2;
      if (6 < uVar1) {
        return 0;
      }
      if ((0x5fU >> (uVar1 & 0x1f) & 1) == 0) {
        return 0;
      }
      pEmitter->pChannelAzimuths =
           (float *)(&DAT_00126290 + *(int *)(&DAT_00126290 + (ulong)uVar1 * 4));
    }
    if (pEmitter->pVolumeCurve == (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      pEmitter->pVolumeCurve = &FACT3DCalculate::DefaultCurve;
    }
    if (pEmitter->pLFECurve == (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      pEmitter->pLFECurve = &FACT3DCalculate::DefaultCurve;
    }
    F3DAudioCalculate(F3DInstance,pListener,pEmitter,0x61,pDSPSettings);
  }
  return 0;
}

Assistant:

uint32_t FACT3DCalculate(
	F3DAUDIO_HANDLE F3DInstance,
	const F3DAUDIO_LISTENER *pListener,
	F3DAUDIO_EMITTER *pEmitter,
	F3DAUDIO_DSP_SETTINGS *pDSPSettings
) {
	static F3DAUDIO_DISTANCE_CURVE_POINT DefaultCurvePoints[2] =
	{
		{ 0.0f, 1.0f },
		{ 1.0f, 1.0f }
	};
	static F3DAUDIO_DISTANCE_CURVE DefaultCurve =
	{
		(F3DAUDIO_DISTANCE_CURVE_POINT*) &DefaultCurvePoints[0], 2
	};

	if (pListener == NULL || pEmitter == NULL || pDSPSettings == NULL)
	{
		return 0;
	}

	if (pEmitter->ChannelCount > 1 && pEmitter->pChannelAzimuths == NULL)
	{
		pEmitter->ChannelRadius = 1.0f;

		if (pEmitter->ChannelCount == 2)
		{
			pEmitter->pChannelAzimuths = (float*) &aStereoLayout[0];
		}
		else if (pEmitter->ChannelCount == 3)
		{
			pEmitter->pChannelAzimuths = (float*) &a2Point1Layout[0];
		}
		else if (pEmitter->ChannelCount == 4)
		{
			pEmitter->pChannelAzimuths = (float*) &aQuadLayout[0];
		}
		else if (pEmitter->ChannelCount == 5)
		{
			pEmitter->pChannelAzimuths = (float*) &a4Point1Layout[0];
		}
		else if (pEmitter->ChannelCount == 6)
		{
			pEmitter->pChannelAzimuths = (float*) &a5Point1Layout[0];
		}
		else if (pEmitter->ChannelCount == 8)
		{
			pEmitter->pChannelAzimuths = (float*) &a7Point1Layout[0];
		}
		else
		{
			return 0;
		}
	}

	if (pEmitter->pVolumeCurve == NULL)
	{
		pEmitter->pVolumeCurve = &DefaultCurve;
	}
	if (pEmitter->pLFECurve == NULL)
	{
		pEmitter->pLFECurve = &DefaultCurve;
	}

	F3DAudioCalculate(
		F3DInstance,
		pListener,
		pEmitter,
		(
			F3DAUDIO_CALCULATE_MATRIX |
			F3DAUDIO_CALCULATE_DOPPLER |
			F3DAUDIO_CALCULATE_EMITTER_ANGLE
		),
		pDSPSettings
	);
	return 0;
}